

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O3

void __thiscall
duckdb::ChimpGroupState<unsigned_int>::LoadFlags
          (ChimpGroupState<unsigned_int> *this,uint8_t *packed_data,idx_t group_size)

{
  ulong uVar1;
  ulong uVar2;
  
  this->flags[0] = VALUE_IDENTICAL;
  if (group_size != 0) {
    uVar1 = 0;
    do {
      uVar2 = (ulong)((uint)uVar1 & 3);
      this->flags[uVar1 + 1] =
           (*(byte *)((long)&FlagBufferConstants::MASKS + uVar2) &
           packed_data[uVar1 >> 2 & 0x3fffffff]) >>
           (*(byte *)((long)&FlagBufferConstants::SHIFTS + uVar2) & 0x1f);
      uVar1 = uVar1 + 1;
    } while (group_size != uVar1);
  }
  this->max_flags_to_read = group_size;
  this->index = 0;
  return;
}

Assistant:

void LoadFlags(uint8_t *packed_data, idx_t group_size) {
		FlagBuffer<false> flag_buffer;
		flag_buffer.SetBuffer(packed_data);
		flags[0] = ChimpConstants::Flags::VALUE_IDENTICAL; // First value doesn't require a flag
		for (idx_t i = 0; i < group_size; i++) {
			flags[1 + i] = (ChimpConstants::Flags)flag_buffer.Extract();
		}
		max_flags_to_read = group_size;
		index = 0;
	}